

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcap.c
# Opt level: O3

int pcap_fileno(pcap_t *p)

{
  return p->fd;
}

Assistant:

int
pcap_fileno(pcap_t *p)
{
#ifndef _WIN32
	return (p->fd);
#else
	if (p->adapter != NULL)
		return ((int)(DWORD)p->adapter->hFile);
	else
		return (PCAP_ERROR);
#endif
}